

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileLockPool.cxx
# Opt level: O0

void __thiscall cmFileLockPool::ScopePool::~ScopePool(ScopePool *this)

{
  ScopePool *this_local;
  
  cmDeleteAll<std::vector<cmFileLock*,std::allocator<cmFileLock*>>>(&this->Locks);
  std::vector<cmFileLock_*,_std::allocator<cmFileLock_*>_>::~vector(&this->Locks);
  return;
}

Assistant:

cmFileLockPool::ScopePool::~ScopePool()
{
  cmDeleteAll(this->Locks);
}